

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpecialFormat.cpp
# Opt level: O3

TrackData * Generate8KSectorTrack(TrackData *__return_storage_ptr__,CylHead *cylhead,Track *track)

{
  void *pvVar1;
  bool bVar2;
  Sector *this;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *__x;
  BitBuffer *bitstream;
  Data data;
  BitstreamTrackBuilder bitbuf;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_b8;
  BitstreamTrackBuilder local_a0;
  
  bVar2 = Is8KSectorTrack(track);
  if (bVar2) {
    BitstreamTrackBuilder::BitstreamTrackBuilder(&local_a0,_250K,MFM);
    TrackBuilder::addGap(&local_a0.super_TrackBuilder,0x10,-1);
    TrackBuilder::addIAM(&local_a0.super_TrackBuilder);
    TrackBuilder::addGap(&local_a0.super_TrackBuilder,0x10,-1);
    this = Track::operator[](track,0);
    TrackBuilder::addSectorUpToData(&local_a0.super_TrackBuilder,&this->header,this->dam);
    __x = &Sector::data_copy(this,0)->super_vector<unsigned_char,_std::allocator<unsigned_char>_>;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector(&local_b8,__x);
    if (0x18a3 < (int)local_b8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_finish -
                 (int)local_b8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_start) {
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize(&local_b8,0x18a3);
    }
    TrackBuilder::addBlock(&local_a0.super_TrackBuilder,(Data *)&local_b8);
    TrackBuilder::addGap
              (&local_a0.super_TrackBuilder,
               ((int)local_b8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                     _M_impl.super__Vector_impl_data._M_start -
               (int)local_b8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_finish) + 0x18a3,-1);
    bitstream = BitstreamTrackBuilder::buffer(&local_a0);
    TrackData::TrackData(__return_storage_ptr__,cylhead,bitstream);
    pvVar1 = (void *)CONCAT44(local_b8.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_start._4_4_,
                              (int)local_b8.
                                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                   ._M_impl.super__Vector_impl_data._M_start);
    if (pvVar1 != (void *)0x0) {
      operator_delete(pvVar1,(long)local_b8.
                                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                   ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)pvVar1
                     );
    }
    if (local_a0.m_buffer.m_sync_losses.super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_a0.m_buffer.m_sync_losses.super__Vector_base<int,_std::allocator<int>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)local_a0.m_buffer.m_sync_losses.
                            super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_a0.m_buffer.m_sync_losses.
                            super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    if (local_a0.m_buffer.m_indexes.super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_a0.m_buffer.m_indexes.super__Vector_base<int,_std::allocator<int>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)local_a0.m_buffer.m_indexes.
                            super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_a0.m_buffer.m_indexes.
                            super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    if (local_a0.m_buffer.m_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
        _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_a0.m_buffer.m_data.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_a0.m_buffer.m_data.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_a0.m_buffer.m_data.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
    return __return_storage_ptr__;
  }
  __assert_fail("Is8KSectorTrack(track)",
                "/workspace/llm4binary/github/license_c_cmakelists/simonowen[P]samdisk/src/SpecialFormat.cpp"
                ,0x2ae,"TrackData Generate8KSectorTrack(const CylHead &, const Track &)");
}

Assistant:

TrackData Generate8KSectorTrack(const CylHead& cylhead, const Track& track)
{
    assert(Is8KSectorTrack(track));

    BitstreamTrackBuilder bitbuf(DataRate::_250K, Encoding::MFM);
    bitbuf.addGap(16);  // gap 4a
    bitbuf.addIAM();
    bitbuf.addGap(16);  // gap 1

    auto& sector{ track[0] };
    bitbuf.addSectorUpToData(sector.header, sector.dam);

    // Maximum size of long-track version used by Coin-Op Hits
    static constexpr auto max_size{ 0x18a3 };
    auto data = sector.data_copy();
    if (data.size() > max_size)
        data.resize(max_size);

    bitbuf.addBlock(data);
    bitbuf.addGap(max_size - data.size());

    return TrackData(cylhead, std::move(bitbuf.buffer()));
}